

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture_fuzz.cpp
# Opt level: O1

bool __thiscall capture_fuzz::FuzzPacket(capture_fuzz *this,uint8_t *packet,size_t packet_length)

{
  ulong uVar1;
  uint8_t *puVar2;
  ulong uVar3;
  ulong uVar4;
  size_t new_size;
  ulong uVar5;
  
  uVar1 = this->fuzz_random_context + 0x9e3779b97f4a7c15;
  this->fuzz_random_context = uVar1;
  if (7 < packet_length) {
    uVar1 = (uVar1 >> 0x1e ^ uVar1) * -0x40a7b892e31b1a47;
    uVar1 = (uVar1 >> 0x1b ^ uVar1) * -0x6b2fb644ecceee15;
    uVar1 = uVar1 >> 0x1f ^ uVar1;
    if (this->buffer_size < packet_length) {
      puVar2 = (uint8_t *)operator_new__(packet_length);
      if (this->buffer != (uint8_t *)0x0) {
        operator_delete__(this->buffer);
      }
      this->buffer = puVar2;
      this->buffer_size = packet_length;
    }
    uVar5 = 0;
    memcpy(this->buffer,packet,packet_length);
    uVar3 = this->fuzz_random_context + 0x9e3779b97f4a7c15;
    this->fuzz_random_context = uVar3;
    uVar3 = (uVar3 >> 0x1e ^ uVar3) * -0x40a7b892e31b1a47;
    uVar3 = (uVar3 >> 0x1b ^ uVar3) * -0x6b2fb644ecceee15;
    uVar3 = uVar3 >> 0x1f ^ uVar3;
    do {
      packet[uVar5] = (uint8_t)uVar3;
      if (((uint)(uVar1 >> 0x11) & 7) <= uVar5) break;
      uVar3 = uVar3 >> 8;
      uVar4 = uVar1 % packet_length + 1 + uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar4 < packet_length);
    this->fuzzed_length = packet_length;
  }
  return 7 < packet_length;
}

Assistant:

bool capture_fuzz::FuzzPacket(uint8_t * packet, size_t packet_length)
{
    bool ret = true;
    uint64_t random_pilot = picoquic_test_random(&fuzz_random_context);

    if (packet_length < 8) {
        return false;
    }

    /* Reallocate the capture buffer */
    if (packet_length > buffer_size)
    {
        size_t new_size = packet_length;
        uint8_t * new_buf = new uint8_t[packet_length];
        if (new_buf == NULL)
        {
            ret = false;
        }
        else
        {
            if (buffer != NULL)
            {
                delete[] buffer;
            }
            buffer = new_buf;
            buffer_size = new_size;
        }
    }

    if (ret) {
        /* smash some random location in the packet */
        size_t x = random_pilot % packet_length;
        size_t y = (size_t)((random_pilot >> 17) & 0x07) + 1;

        memcpy(buffer, packet, packet_length);

        random_pilot = picoquic_test_random(&fuzz_random_context);
        for (size_t i = 0; i < y && x + i < packet_length; i++) {
            packet[i] = (uint8_t)(random_pilot & 0xFF);
            random_pilot >>= 8;
        }

        fuzzed_length = packet_length;
    }

    return ret;
}